

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

bool __thiscall ON_LengthValue::Read(ON_LengthValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  AngleUnitSystem AVar2;
  StringFormat SVar3;
  byte bVar4;
  uint u;
  uint context_angle_unit_system_as_unsigned;
  int content_version;
  uint local_24;
  uint local_20;
  int local_1c;
  
  operator=(this,&Unset);
  local_1c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_1c);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadDouble(archive,&this->m_length);
  if ((bVar1) && (bVar1 = ON_UnitSystem::Read(&this->m_length_unit_system,archive), bVar1)) {
    local_20 = (uint)this->m_context_angle_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&local_20);
    if (bVar1) {
      AVar2 = ON::AngleUnitSystemFromUnsigned(local_20);
      this->m_context_angle_unit_system = AVar2;
      if ((AVar2 == Unset) || (AVar2 == None)) {
        this->m_context_angle_unit_system = Radians;
      }
      bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_context_locale_id);
      if ((bVar1) &&
         (bVar1 = ON_BinaryArchive::ReadString(archive,&this->m_length_as_string), bVar1)) {
        bVar4 = 1;
        if (local_1c < 1) goto LAB_005c9af1;
        local_24 = (uint)this->m_string_format;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&local_24);
        if (bVar1) {
          SVar3 = LengthStringFormatFromUnsigned(local_24);
          this->m_string_format = SVar3;
          goto LAB_005c9af1;
        }
      }
    }
  }
  bVar4 = 0;
LAB_005c9af1:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar4);
}

Assistant:

bool ON_LengthValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_LengthValue::Unset;

  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_length))
      break;
    if (!m_length_unit_system.Read(archive))
      break;

    unsigned int context_angle_unit_system_as_unsigned = static_cast<unsigned int>(m_context_angle_unit_system);
    if (!archive.ReadInt(&context_angle_unit_system_as_unsigned))
      break;
    m_context_angle_unit_system = ON::AngleUnitSystemFromUnsigned(context_angle_unit_system_as_unsigned);
    if (ON::AngleUnitSystem::None == m_context_angle_unit_system || ON::AngleUnitSystem::Unset == m_context_angle_unit_system)
      m_context_angle_unit_system = ON::AngleUnitSystem::Radians;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_length_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_LengthValue::LengthStringFormatFromUnsigned(u);
    }

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}